

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O0

void __thiscall QFont::QFont(QFont *this,QStringList *families,int pointSize,int weight,bool italic)

{
  QFontPrivate *pQVar1;
  uint in_ECX;
  int in_EDX;
  QList<QString> *in_RSI;
  long in_RDI;
  byte in_R8B;
  double dVar2;
  QFontPrivate *in_stack_ffffffffffffffb8;
  QFontPrivate *in_stack_ffffffffffffffc0;
  uint local_18;
  int local_14;
  
  operator_new(0x98);
  QFontPrivate::QFontPrivate(in_stack_ffffffffffffffc0);
  QExplicitlySharedDataPointer<QFontPrivate>::QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QFontPrivate> *)in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8);
  *(undefined4 *)(in_RDI + 8) = 0x20000;
  if (in_EDX < 1) {
    local_14 = 0xc;
  }
  else {
    *(uint *)(in_RDI + 8) = *(uint *)(in_RDI + 8) | 2;
    local_14 = in_EDX;
  }
  if ((int)in_ECX < 0) {
    local_18 = 400;
  }
  else {
    *(uint *)(in_RDI + 8) = *(uint *)(in_RDI + 8) | 0x30;
    local_18 = in_ECX;
  }
  if ((in_R8B & 1) != 0) {
    *(uint *)(in_RDI + 8) = *(uint *)(in_RDI + 8) | 0x20;
  }
  QExplicitlySharedDataPointer<QFontPrivate>::operator->
            ((QExplicitlySharedDataPointer<QFontPrivate> *)0x7119a5);
  QList<QString>::operator=((QList<QString> *)in_stack_ffffffffffffffc0,in_RSI);
  dVar2 = (double)local_14;
  pQVar1 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                     ((QExplicitlySharedDataPointer<QFontPrivate> *)0x7119cb);
  (pQVar1->request).pointSize = dVar2;
  pQVar1 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                     ((QExplicitlySharedDataPointer<QFontPrivate> *)0x7119e0);
  (pQVar1->request).pixelSize = -1.0;
  pQVar1 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                     ((QExplicitlySharedDataPointer<QFontPrivate> *)0x7119ff);
  *(ulong *)&(pQVar1->request).field_0x60 =
       *(ulong *)&(pQVar1->request).field_0x60 & 0xfffc00ffffffffff |
       ((ulong)local_18 & 0x3ff) << 0x28;
  pQVar1 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                     ((QExplicitlySharedDataPointer<QFontPrivate> *)0x711a49);
  *(ulong *)&(pQVar1->request).field_0x60 =
       *(ulong *)&(pQVar1->request).field_0x60 & 0xffffffffcfffffff |
       (ulong)((in_R8B & 1) != 0) << 0x1c;
  return;
}

Assistant:

QFont::QFont(const QStringList &families, int pointSize, int weight, bool italic)
    : d(new QFontPrivate()), resolve_mask(QFont::FamiliesResolved)
{
    if (pointSize <= 0)
        pointSize = 12;
    else
        resolve_mask |= QFont::SizeResolved;

    if (weight < 0)
        weight = Normal;
    else
        resolve_mask |= QFont::WeightResolved | QFont::StyleResolved;

    if (italic)
        resolve_mask |= QFont::StyleResolved;

    d->request.families = families;
    d->request.pointSize = qreal(pointSize);
    d->request.pixelSize = -1;
    d->request.weight = weight;
    d->request.style = italic ? QFont::StyleItalic : QFont::StyleNormal;
}